

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

Window glfwGetX11Window(GLFWwindow *handle)

{
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (_glfw.platform.platformID == 0x60004) {
      return *(Window *)(handle + 0x358);
    }
    format = "X11: Platform not initialized";
    code = 0x1000e;
  }
  _glfwInputError(code,format);
  return 0;
}

Assistant:

GLFWAPI Window glfwGetX11Window(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "X11: Platform not initialized");
        return None;
    }

    return window->x11.handle;
}